

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O1

double primary(void)

{
  string *psVar1;
  string *s;
  double dVar2;
  runtime_error *prVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dc_07;
  uint extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  uint extraout_XMM0_Dd_03;
  uint extraout_XMM0_Dd_04;
  uint uVar5;
  uint extraout_XMM0_Dd_05;
  uint extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  Token prevToken;
  Token t;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [16];
  pointer local_c8;
  undefined8 uStack_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [16];
  long *local_88;
  long local_78 [2];
  undefined1 local_68 [16];
  pointer local_50;
  double dStack_48;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_d8._8_8_ = local_d8._0_8_;
  Token_stream::get((Token *)&local_c8,&ts);
  if ((byte)local_c8 < 0x4e) {
    if ((byte)local_c8 < 0x2d) {
      if ((byte)local_c8 == 0x28) {
        dVar2 = expression();
        local_d8._8_4_ = extraout_XMM0_Dc_02;
        local_d8._0_8_ = dVar2;
        local_d8._12_4_ = extraout_XMM0_Dd_02;
        Token_stream::get((Token *)local_108,&ts);
        uStack_c0 = (double)CONCAT44(local_108._12_4_,local_108._8_4_);
        local_c8 = (pointer)local_108._0_8_;
        std::__cxx11::string::operator=((string *)&local_b8,(string *)(local_108 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_allocated_capacity != &local_e8) {
          operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1)
          ;
        }
        if ((byte)local_c8 != ')') {
          local_108._0_8_ = (string *)(local_108 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"\'(\' expected","");
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,(string *)local_108);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0010322a;
      }
      if ((byte)local_c8 != 0x2b) goto LAB_00103305;
      dVar2 = primary();
      uVar4 = extraout_XMM0_Dc;
      uVar5 = extraout_XMM0_Dd;
    }
    else {
      if ((byte)local_c8 != 0x2d) {
        if ((byte)local_c8 == 0x38) {
          if ((-2147483648.0 <= uStack_c0) && (uStack_c0 <= 2147483647.0)) {
            local_d8._8_8_ = 0;
            local_d8._0_8_ = uStack_c0;
            if ((uStack_c0 != (double)(int)uStack_c0) ||
               (NAN(uStack_c0) || NAN((double)(int)uStack_c0))) {
              local_108._0_8_ = local_108 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_108,"calculator can handle only integer input","");
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar3,(string *)local_108);
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0010322a;
          }
          goto LAB_00103334;
        }
LAB_00103305:
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"primary expected","");
        error((string *)local_108);
        uStack_c0 = (double)std::__cxx11::string::~string((string *)local_108);
LAB_00103334:
        compose_owerflow_err_msg_abi_cxx11_((string *)local_108,uStack_c0);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,(string *)local_108);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar2 = primary();
      dVar2 = -dVar2;
      uVar5 = extraout_XMM0_Dd_04 ^ 0x80000000;
      uVar4 = extraout_XMM0_Dc_04;
    }
  }
  else if ((byte)local_c8 < 0x52) {
    if ((byte)local_c8 == 0x4e) {
      dVar2 = primary();
      dVar2 = log(dVar2);
      uVar4 = extraout_XMM0_Dc_03;
      uVar5 = extraout_XMM0_Dd_03;
    }
    else {
      if ((byte)local_c8 != 0x50) goto LAB_00103305;
      Token_stream::get((Token *)local_108,&ts);
      local_c8 = (pointer)local_108._0_8_;
      std::__cxx11::string::operator=((string *)&local_b8,(string *)(local_108 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_allocated_capacity != &local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1);
      }
      if ((byte)local_c8 != '(') {
        local_108._0_8_ = (string *)(local_108 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"\'(\' expected after pow","");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,(string *)local_108);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_d8._0_8_ = expression();
      Token_stream::get((Token *)local_108,&ts);
      psVar1 = (string *)(local_108 + 0x10);
      local_c8 = (pointer)local_108._0_8_;
      std::__cxx11::string::operator=((string *)&local_b8,psVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_allocated_capacity != &local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1);
      }
      if ((byte)local_c8 != ',') {
        local_108._0_8_ = psVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"\',\' expected","");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,(string *)local_108);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar2 = expression();
      local_68._8_4_ = extraout_XMM0_Dc_00;
      local_68._0_8_ = dVar2;
      local_68._12_4_ = extraout_XMM0_Dd_00;
      if ((dVar2 != (double)(int)dVar2) || (NAN(dVar2) || NAN((double)(int)dVar2))) {
        local_108._0_8_ = psVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"exponent for pow function must be an iteger","");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,(string *)local_108);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Token_stream::get((Token *)local_108,&ts);
      uStack_c0 = (double)CONCAT44(local_108._12_4_,local_108._8_4_);
      local_c8 = (pointer)local_108._0_8_;
      std::__cxx11::string::operator=((string *)&local_b8,(string *)(local_108 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_allocated_capacity != &local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1);
      }
      if ((byte)local_c8 != ')') {
        local_108._0_8_ = (string *)(local_108 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"\')\' expected","");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,(string *)local_108);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar2 = pow((double)local_d8._0_8_,(double)local_68._0_8_);
      uVar4 = extraout_XMM0_Dc_01;
      uVar5 = extraout_XMM0_Dd_01;
    }
  }
  else {
    if ((byte)local_c8 != 0x52) {
      if ((byte)local_c8 == 0x61) {
        s = (string *)(local_108 + 0x10);
        local_f8._M_allocated_capacity = (size_type)&local_e8;
        local_108._8_8_ = uStack_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)s,local_b8._M_p,local_b8._M_p + local_b0);
        Token_stream::get((Token *)&local_50,&ts);
        local_c8 = local_50;
        uStack_c0 = dStack_48;
        std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_p != &local_30) {
          operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
        }
        if ((byte)local_c8 == '=') {
          dVar2 = expression();
          Symbol_table::set_value(&st,s,dVar2);
        }
        else {
          local_98._0_4_ = local_c8._0_4_;
          local_98._4_4_ = local_c8._4_4_;
          local_98._8_4_ = (undefined4)uStack_c0;
          local_98._12_4_ = uStack_c0._4_4_;
          local_88 = local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,local_b8._M_p,local_b8._M_p + local_b0);
          ts.buffer._4_4_ = local_98._4_4_;
          ts.buffer._0_4_ = local_98._0_4_;
          ts.buffer.value = (double)CONCAT44(local_98._12_4_,local_98._8_4_);
          std::__cxx11::string::_M_assign((string *)&ts.buffer.name);
          ts.full = true;
          if (local_88 != local_78) {
            operator_delete(local_88,local_78[0] + 1);
          }
        }
        dVar2 = Symbol_table::get_value(&st,s);
        local_d8._8_4_ = extraout_XMM0_Dc_07;
        local_d8._0_8_ = dVar2;
        local_d8._12_4_ = extraout_XMM0_Dd_07;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_allocated_capacity != &local_e8) {
          operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1)
          ;
        }
        goto LAB_0010322a;
      }
      goto LAB_00103305;
    }
    dVar2 = expression();
    if (dVar2 < 0.0) {
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"square root is defined for non negative numbers","");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,(string *)local_108);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
      uVar4 = extraout_XMM0_Dc_06;
      uVar5 = extraout_XMM0_Dd_06;
    }
    else {
      dVar2 = SQRT(dVar2);
      uVar4 = extraout_XMM0_Dc_05;
      uVar5 = extraout_XMM0_Dd_05;
    }
  }
  local_d8._8_4_ = uVar4;
  local_d8._0_8_ = dVar2;
  local_d8._12_4_ = uVar5;
LAB_0010322a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  return (double)local_d8._0_8_;
}

Assistant:

double primary()
{
	Token t = ts.get();
	switch (t.kind)
	{
	case '(':
	{
		double d = expression();
		t = ts.get();
		if (t.kind != ')') error("'(' expected");
		return d;
	}
	case '-':
		return -primary();
	case '+':
		return primary();
	case number:
	{
		if (is_out_of_int32_range(t.value))
			error(compose_owerflow_err_msg(t.value));
		else if (static_cast<int32_t>(t.value) != t.value)
			error("calculator can handle only integer input");
		return t.value;
	}
	case square_root:
	{
		auto d = expression();
		if (d < 0)
			error("square root is defined for non negative numbers");
		return sqrt(d);
	}
	case power:
	{
		t = ts.get();
		if (t.kind != '(')
			error("'(' expected after pow");
		double base = expression();
		t = ts.get();
		if (t.kind != ',')
			error("',' expected");
		auto exponent = expression();
		if (static_cast<int32_t>(exponent) != exponent)
			error("exponent for pow function must be an iteger");
		t = ts.get();
		if (t.kind != ')')
			error("')' expected");
		return pow(base, exponent);
	}
	case name:
	{
		auto prevToken = t;
		t = ts.get();
		if (t.kind != '=')
		{
			ts.unget(t);
			return st.get_value(prevToken.name);
		}
		st.set_value(prevToken.name, expression());
		return st.get_value(prevToken.name);
	}
	case natural_log:
		return log(primary());
	default:
		error("primary expected");
	}
}